

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.cpp
# Opt level: O0

void bounce(ItemThing *weap,char *mname,bool noend)

{
  bool noend_local;
  char *mname_local;
  ItemThing *weap_local;
  
  if (!to_death) {
    if (weap->type == 0x29) {
      addmsg("the %s misses ",weap_info[weap->which].oi_name);
    }
    else {
      addmsg("you missed ");
    }
    addmsg(mname);
    if (!noend) {
      endmsg();
    }
  }
  return;
}

Assistant:

void bounce(ItemThing *weap, const char *mname, bool noend)
{
    if (to_death)
        return;
    if (weap->type == WEAPON)
        addmsg("the %s misses ", weap_info[weap->which].oi_name);
    else
        addmsg("you missed ");
    addmsg(mname);
    if (!noend)
        endmsg();
}